

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# win_helper.c
# Opt level: O0

void helper_flushw_sparc64(CPUSPARCState_conflict2 *env)

{
  uintptr_t unaff_retaddr;
  uint local_18;
  int tt;
  CPUSPARCState_conflict2 *env_local;
  
  if (env->cansave != env->nwindows - 2) {
    if (env->otherwin == 0) {
      local_18 = (env->wstate & 7) << 2;
    }
    else {
      local_18 = (env->wstate & 0x38) >> 1 | 0x20;
    }
    cpu_raise_exception_ra_sparc64((CPUSPARCState_conflict1 *)env,local_18 | 0x80,unaff_retaddr);
  }
  return;
}

Assistant:

void helper_flushw(CPUSPARCState *env)
{
    if (env->cansave != env->nwindows - 2) {
        int tt = TT_SPILL | (env->otherwin != 0
                             ? (TT_WOTHER | ((env->wstate & 0x38) >> 1))
                             : ((env->wstate & 0x7) << 2));
        cpu_raise_exception_ra(env, tt, GETPC());
    }
}